

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzsfulmat.cpp
# Opt level: O2

void __thiscall
TPZSFMatrix<long_double>::TPZSFMatrix
          (TPZSFMatrix<long_double> *this,void **vtt,TPZMatrix<long_double> *A)

{
  _func_int **pp_Var1;
  undefined4 uVar2;
  undefined4 uVar3;
  int64_t iVar4;
  char cVar5;
  int iVar6;
  uint extraout_var;
  longdouble *plVar7;
  undefined4 extraout_var_00;
  long lVar8;
  int64_t c;
  long lVar9;
  int64_t r;
  long lVar10;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble in_ST7;
  
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)vtt[3];
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)vtt[2];
  uVar2 = *(undefined4 *)((long)&(A->super_TPZBaseMatrix).fRow + 4);
  iVar4 = (A->super_TPZBaseMatrix).fCol;
  uVar3 = *(undefined4 *)((long)&(A->super_TPZBaseMatrix).fCol + 4);
  *(int *)&(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow =
       (int)(A->super_TPZBaseMatrix).fRow;
  *(undefined4 *)((long)&(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow + 4) = uVar2;
  *(int *)&(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol = (int)iVar4;
  *(undefined4 *)((long)&(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol + 4) = uVar3;
  cVar5 = (A->super_TPZBaseMatrix).fDefPositive;
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fDecomposed =
       (A->super_TPZBaseMatrix).fDecomposed;
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fDefPositive = cVar5;
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)vtt[1];
  pp_Var1 = (_func_int **)*vtt;
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       pp_Var1;
  iVar6 = (*pp_Var1[0x4b])();
  lVar10 = 0;
  plVar7 = (longdouble *)
           operator_new__(-(ulong)(extraout_var >> 0x1c != 0) | CONCAT44(extraout_var,iVar6) << 4);
  this->fElem = plVar7;
  lVar8 = 1;
  while( true ) {
    iVar6 = (*(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
              _vptr_TPZSavable[0xc])(this);
    if (CONCAT44(extraout_var_00,iVar6) <= lVar10) break;
    for (lVar9 = 0; lVar8 != lVar9; lVar9 = lVar9 + 1) {
      (*(A->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(A,lVar10,lVar9);
      *plVar7 = in_ST0;
      plVar7 = plVar7 + 1;
      in_ST0 = in_ST1;
      in_ST1 = in_ST2;
      in_ST2 = in_ST3;
      in_ST3 = in_ST4;
      in_ST4 = in_ST5;
      in_ST5 = in_ST6;
      in_ST6 = in_ST7;
    }
    lVar10 = lVar10 + 1;
    lVar8 = lVar8 + 1;
  }
  return;
}

Assistant:

TPZSFMatrix<TVar> ::TPZSFMatrix(const  TPZMatrix<TVar>  &A )
: TPZRegisterClassId(&TPZSFMatrix::ClassId),
TPZMatrix<TVar> ( A )
{
    int64_t size = Size();
	fElem = new TVar[size] ;
	
	if ( fElem == NULL )
		TPZMatrix<TVar> ::Error(__PRETTY_FUNCTION__, "Constructor <memory allocation error>." );
	
	// Copia a matriz
	TVar *dst = fElem;
	for ( int64_t r = 0; r < this->Dim(); r++ )
		for ( int64_t c = 0; c <= r; c++ )
			*dst++ = A.GetVal( r, c );
}